

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::MemInvalidate(CodeGenGenericContext *this,x86Argument *address)

{
  uint uVar1;
  MemCache *pMVar2;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint writeSize;
  uint readSize;
  x86Argument *write;
  MemCache *entry;
  uint i;
  x86Argument *address_local;
  CodeGenGenericContext *this_local;
  
  entry._4_4_ = 0;
  do {
    if (0xf < entry._4_4_) {
      return;
    }
    pMVar2 = this->memCache + entry._4_4_;
    if (((pMVar2->address).type != argNone) &&
       ((((address->ptrIndex != rNONE || (address->ptrBase != rEBX)) ||
         (((pMVar2->address).ptrIndex == rNONE && ((pMVar2->address).ptrBase == rEBX)))) &&
        ((((address->ptrIndex == rNONE && (address->ptrBase == rEBX)) ||
          ((pMVar2->address).ptrIndex != rNONE)) || ((pMVar2->address).ptrBase != rEBX)))))) {
      if ((((address->ptrIndex == rNONE) && (address->ptrBase == rEBX)) &&
          ((pMVar2->address).ptrIndex == rNONE)) && ((pMVar2->address).ptrBase == rEBX)) {
        if ((address->field_1).reg == rNONE) {
          __assert_fail("address.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x80,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
        }
        if ((pMVar2->address).field_1.reg == rNONE) {
          __assert_fail("write.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x81,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
        }
        if ((address->field_1).reg == rEAX) {
          local_44 = 1;
        }
        else {
          if ((address->field_1).reg == rEBX) {
            local_48 = 2;
          }
          else {
            local_48 = 8;
            if ((address->field_1).reg == rECX) {
              local_48 = 4;
            }
          }
          local_44 = local_48;
        }
        if ((pMVar2->address).field_1.reg == rEAX) {
          local_4c = 1;
        }
        else {
          if ((pMVar2->address).field_1.reg == rEBX) {
            local_50 = 2;
          }
          else {
            local_50 = 8;
            if ((pMVar2->address).field_1.reg == rECX) {
              local_50 = 4;
            }
          }
          local_4c = local_50;
        }
        if (((uint)(address->ptrNum + local_44) <= (uint)(pMVar2->address).ptrNum) ||
           ((uint)((pMVar2->address).ptrNum + local_4c) <= (uint)address->ptrNum))
        goto LAB_003a476b;
      }
      (pMVar2->address).type = argNone;
      (pMVar2->value).type = argNone;
      if (0xf < this->memCacheFreeSlotCount) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x8d,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
      }
      uVar1 = this->memCacheFreeSlotCount;
      this->memCacheFreeSlotCount = uVar1 + 1;
      this->memCacheFreeSlots[uVar1] = entry._4_4_;
    }
LAB_003a476b:
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemInvalidate(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argNone)
			continue;

		x86Argument &write = entry.address;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.address.type = x86Argument::argNone;
		entry.value.type = x86Argument::argNone;

		assert(memCacheFreeSlotCount < memoryStateSize);
		memCacheFreeSlots[memCacheFreeSlotCount++] = i;
	}
}